

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_nls.c
# Opt level: O2

int idaNlsInit(IDAMem IDA_mem)

{
  int iVar1;
  code *pcVar2;
  char *msgfmt;
  
  if (IDA_mem->ida_lsetup ==
      (_func_int_IDAMemRec_ptr_N_Vector_N_Vector_N_Vector_N_Vector_N_Vector_N_Vector *)0x0) {
    pcVar2 = (code *)0x0;
  }
  else {
    pcVar2 = idaNlsLSetup;
  }
  iVar1 = SUNNonlinSolSetLSetupFn(IDA_mem->NLS,pcVar2);
  if (iVar1 == 0) {
    if (IDA_mem->ida_lsolve ==
        (_func_int_IDAMemRec_ptr_N_Vector_N_Vector_N_Vector_N_Vector_N_Vector *)0x0) {
      pcVar2 = (code *)0x0;
    }
    else {
      pcVar2 = idaNlsLSolve;
    }
    iVar1 = SUNNonlinSolSetLSolveFn(IDA_mem->NLS,pcVar2);
    if (iVar1 == 0) {
      iVar1 = SUNNonlinSolInitialize(IDA_mem->NLS);
      if (iVar1 == 0) {
        return 0;
      }
      msgfmt = "The nonlinear solver\'s init routine failed.";
      iVar1 = 0xe4;
    }
    else {
      msgfmt = "Setting linear solver solve function failed";
      iVar1 = 0xda;
    }
  }
  else {
    msgfmt = "Setting the linear solver setup function failed";
    iVar1 = 0xcc;
  }
  IDAProcessError(IDA_mem,-0x16,iVar1,"idaNlsInit",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/idas/idas_nls.c"
                  ,msgfmt);
  return -0xf;
}

Assistant:

int idaNlsInit(IDAMem IDA_mem)
{
  int retval;

  /* set the linear solver setup wrapper function */
  if (IDA_mem->ida_lsetup)
  {
    retval = SUNNonlinSolSetLSetupFn(IDA_mem->NLS, idaNlsLSetup);
  }
  else { retval = SUNNonlinSolSetLSetupFn(IDA_mem->NLS, NULL); }

  if (retval != IDA_SUCCESS)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Setting the linear solver setup function failed");
    return (IDA_NLS_INIT_FAIL);
  }

  /* set the linear solver solve wrapper function */
  if (IDA_mem->ida_lsolve)
  {
    retval = SUNNonlinSolSetLSolveFn(IDA_mem->NLS, idaNlsLSolve);
  }
  else { retval = SUNNonlinSolSetLSolveFn(IDA_mem->NLS, NULL); }

  if (retval != IDA_SUCCESS)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Setting linear solver solve function failed");
    return (IDA_NLS_INIT_FAIL);
  }

  /* initialize nonlinear solver */
  retval = SUNNonlinSolInitialize(IDA_mem->NLS);

  if (retval != IDA_SUCCESS)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_NLS_INIT_FAIL);
    return (IDA_NLS_INIT_FAIL);
  }

  return (IDA_SUCCESS);
}